

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall
wasm::PrintExpressionContents::visitStringAs(PrintExpressionContents *this,StringAs *curr)

{
  StringAsOp SVar1;
  long lVar2;
  ostream *stream;
  char *pcVar3;
  
  SVar1 = curr->op;
  if (SVar1 == StringAsIter) {
    stream = this->o;
    Colors::outputColorCode(stream,"\x1b[35m");
    Colors::outputColorCode(stream,"\x1b[1m");
    pcVar3 = "string.as_iter";
  }
  else {
    if (SVar1 == StringAsWTF16) {
      stream = this->o;
      Colors::outputColorCode(stream,"\x1b[35m");
      Colors::outputColorCode(stream,"\x1b[1m");
      pcVar3 = "string.as_wtf16";
      lVar2 = 0xf;
      goto LAB_00848fac;
    }
    if (SVar1 != StringAsWTF8) {
      handle_unreachable("invalid string.as*",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Print.cpp"
                         ,0x9b8);
    }
    stream = this->o;
    Colors::outputColorCode(stream,"\x1b[35m");
    Colors::outputColorCode(stream,"\x1b[1m");
    pcVar3 = "string.as_wtf8";
  }
  lVar2 = 0xe;
LAB_00848fac:
  std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar3,lVar2);
  Colors::outputColorCode(stream,"\x1b[0m");
  return;
}

Assistant:

void visitStringAs(StringAs* curr) {
    switch (curr->op) {
      case StringAsWTF8:
        printMedium(o, "string.as_wtf8");
        break;
      case StringAsWTF16:
        printMedium(o, "string.as_wtf16");
        break;
      case StringAsIter:
        printMedium(o, "string.as_iter");
        break;
      default:
        WASM_UNREACHABLE("invalid string.as*");
    }
  }